

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-color.c
# Opt level: O0

int color_char_to_attr(char c)

{
  int local_14;
  int a;
  char c_local;
  
  if (c < '\0') {
    a = (int)c;
  }
  else if ((c == '\0') || (c == ' ')) {
    a = 0;
  }
  else {
    local_14 = 0;
    while ((local_14 < 0x1d && (color_table[local_14].index_char != c))) {
      local_14 = local_14 + 1;
    }
    if (local_14 == 0x1d) {
      a = 1;
    }
    else {
      a = local_14;
    }
  }
  return a;
}

Assistant:

int color_char_to_attr(char c)
{
	int a;

	/* Is negative -- spit it right back out */
	if (c < 0) return (c);

	/* Is a space or '\0' -- return black */
	if (c == '\0' || c == ' ') return (COLOUR_DARK);

	/* Search the color table */
	for (a = 0; a < BASIC_COLORS; a++)
	{
		/* Look for the index */
		if (color_table[a].index_char == c) break;
	}

	/* If we don't find the color, we assume white */
	if (a == BASIC_COLORS) return (COLOUR_WHITE);

	/* Return the color */
	return (a);
}